

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_plugin.c
# Opt level: O0

int mk_plugin_header_add(mk_http_request *sr,char *row,int len)

{
  mk_iov *pmVar1;
  int len_local;
  char *row_local;
  mk_http_request *sr_local;
  
  if (sr == (mk_http_request *)0x0) {
    mk_print(0x1003,"Bug found in %s() at %s:%d","mk_plugin_header_add",
             "/workspace/llm4binary/github/license_c_cmakelists/monkey[P]monkey/mk_server/mk_plugin.c"
             ,0x2ec);
    abort();
  }
  if ((sr->headers)._extra_rows == (mk_iov *)0x0) {
    pmVar1 = mk_iov_create(0x24,0);
    (sr->headers)._extra_rows = pmVar1;
    if ((sr->headers)._extra_rows == (mk_iov *)0x0) {
      mk_print(0x1003,"Bug found in %s() at %s:%d","mk_plugin_header_add",
               "/workspace/llm4binary/github/license_c_cmakelists/monkey[P]monkey/mk_server/mk_plugin.c"
               ,0x2f7);
      abort();
    }
  }
  mk_iov_add((sr->headers)._extra_rows,row,len,0);
  mk_iov_add((sr->headers)._extra_rows,"\r\n",2,0);
  return 0;
}

Assistant:

int mk_plugin_header_add(struct mk_http_request *sr, char *row, int len)
{
    mk_bug(!sr);

    if (!sr->headers._extra_rows) {
        /*
         * We allocate space for a fixed number of IOV entries:
         *
         *   MK_PLUGIN_HEADER_EXTRA_ROWS = X
         *
         *  we use (MK_PLUGIN_HEADER_EXTRA_ROWS * 2) thinking in an ending CRLF
         */
        sr->headers._extra_rows = mk_iov_create(MK_PLUGIN_HEADER_EXTRA_ROWS * 2, 0);
        mk_bug(!sr->headers._extra_rows);
    }

    mk_iov_add(sr->headers._extra_rows, row, len,
               MK_FALSE);
    mk_iov_add(sr->headers._extra_rows,
               mk_iov_crlf.data, mk_iov_crlf.len,
               MK_FALSE);
    return 0;
}